

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O3

Query * __thiscall
Query::plan(Query *__return_storage_ptr__,Query *this,
           unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
           *types_to_query)

{
  pointer pQVar1;
  pointer pQVar2;
  QueryType QVar3;
  uint32_t uVar4;
  pointer pQVar5;
  vector<Query,_std::allocator<Query>_> plans;
  vector<Query,_std::allocator<Query>_> local_98;
  Query local_78;
  
  QVar3 = this->type;
  if (QVar3 == PRIMITIVE) {
    plan_qstring(__return_storage_ptr__,types_to_query,&this->value);
  }
  else {
    local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pQVar5 = (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
             super__Vector_impl_data._M_start;
    pQVar1 = (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pQVar5 != pQVar1) {
      do {
        plan(&local_78,pQVar5,types_to_query);
        std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>(&local_98,&local_78);
        std::vector<Query,_std::allocator<Query>_>::~vector(&local_78.queries);
        std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_78.value);
        pQVar5 = pQVar5 + 1;
      } while (pQVar5 != pQVar1);
      QVar3 = this->type;
    }
    pQVar2 = local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pQVar1 = local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pQVar5 = local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    if (QVar3 == MIN_OF) {
      uVar4 = this->count;
    }
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_98.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->type = QVar3;
    (__return_storage_ptr__->ngram).itype = GRAM3;
    (__return_storage_ptr__->ngram).trigram = 0;
    __return_storage_ptr__->count = uVar4;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_start = pQVar5;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_finish = pQVar1;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pQVar2;
    std::vector<Query,_std::allocator<Query>_>::~vector(&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

Query Query::plan(const std::unordered_set<IndexType> &types_to_query) const {
    if (type != QueryType::PRIMITIVE) {
        std::vector<Query> plans;
        for (const auto &query : queries) {
            plans.emplace_back(query.plan(types_to_query));
        }
        if (type == QueryType::MIN_OF) {
            return Query(count, std::move(plans));
        }
        return Query(type, std::move(plans));
    }

    return plan_qstring(types_to_query, value);
}